

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall QLocale::timeFormat(QLocale *this,FormatType format)

{
  bool bVar1;
  QLocalePrivate *pQVar2;
  QSystemLocale *this_00;
  int in_EDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QVariant res;
  QVariant *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  DataRange *in_stack_ffffffffffffff68;
  DataRange local_48 [4];
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                     ((QSharedDataPointer<QLocalePrivate> *)0x4cf0e6);
  if (pQVar2->m_data == &systemLocaleData) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    this_00 = systemLocale();
    in_stack_ffffffffffffff64 = 10 - (in_EDX == 0);
    in_stack_ffffffffffffff68 = local_48;
    ::QVariant::QVariant((QVariant *)0x4cf140);
    (*this_00->_vptr_QSystemLocale[2])
              (&local_28,this_00,(ulong)in_stack_ffffffffffffff64,in_stack_ffffffffffffff68);
    ::QVariant::~QVariant((QVariant *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50))
    ;
    bVar1 = ::QVariant::isNull((QVariant *)this_00);
    uVar3 = bVar1;
    if (!bVar1) {
      ::QVariant::toString(in_stack_ffffffffffffff48);
    }
    ::QVariant::~QVariant((QVariant *)CONCAT17(uVar3,in_stack_ffffffffffffff50));
    if (!bVar1) goto LAB_004cf25b;
  }
  if (in_EDX == 0) {
    pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                       ((QSharedDataPointer<QLocalePrivate> *)0x4cf21f);
    QLocaleData::longTimeFormat(pQVar2->m_data);
  }
  else {
    pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                       ((QSharedDataPointer<QLocalePrivate> *)0x4cf238);
    QLocaleData::shortTimeFormat(pQVar2->m_data);
  }
  QLocaleData::DataRange::getData
            (in_stack_ffffffffffffff68,
             (char16_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
LAB_004cf25b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QLocale::timeFormat(FormatType format) const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        QVariant res = systemLocale()->query(format == LongFormat
                                             ? QSystemLocale::TimeFormatLong
                                             : QSystemLocale::TimeFormatShort,
                                             QVariant());
        if (!res.isNull())
            return res.toString();
    }
#endif

    return (format == LongFormat
            ? d->m_data->longTimeFormat()
            : d->m_data->shortTimeFormat()
           ).getData(time_format_data);
}